

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O0

bool __thiscall
DIS::ElectromagneticEmissionBeamData::operator==
          (ElectromagneticEmissionBeamData *this,ElectromagneticEmissionBeamData *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  ElectromagneticEmissionBeamData *rhs_local;
  ElectromagneticEmissionBeamData *this_local;
  
  idx._7_1_ = this->_beamIDNumber == rhs->_beamIDNumber &&
              this->_beamDataLength == rhs->_beamDataLength;
  if (this->_beamParameterIndex != rhs->_beamParameterIndex) {
    idx._7_1_ = false;
  }
  bVar1 = EEFundamentalParameterData::operator==
                    (&this->_fundamentalParameterData,&rhs->_fundamentalParameterData);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = BeamData::operator==(&this->_beamData,&rhs->_beamData);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_beamFunction != rhs->_beamFunction) {
    idx._7_1_ = false;
  }
  if (this->_highDensityTrackJam != rhs->_highDensityTrackJam) {
    idx._7_1_ = false;
  }
  if (this->_beamStatus != rhs->_beamStatus) {
    idx._7_1_ = false;
  }
  bVar1 = JammingTechnique::operator==(&this->_jammingTechnique,&rhs->_jammingTechnique);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  for (local_28 = 0;
      sVar2 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::size
                        (&this->_trackJamTargets), local_28 < sVar2; local_28 = local_28 + 1) {
    this_00 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::operator[]
                        (&this->_trackJamTargets,local_28);
    rhs_00 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::operator[]
                       (&rhs->_trackJamTargets,local_28);
    bVar1 = TrackJamData::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
  }
  return idx._7_1_;
}

Assistant:

bool ElectromagneticEmissionBeamData::operator ==(const ElectromagneticEmissionBeamData& rhs) const
{
    bool ivarsEqual = true;

    if( ! (_beamDataLength == rhs._beamDataLength) ) ivarsEqual = false;
    if( ! (_beamIDNumber == rhs._beamIDNumber) ) ivarsEqual = false;
    if( ! (_beamParameterIndex == rhs._beamParameterIndex) ) ivarsEqual = false;
    if( ! (_fundamentalParameterData == rhs._fundamentalParameterData) ) ivarsEqual = false;
	if (! (_beamData == rhs._beamData)) ivarsEqual = false;
    if( ! (_beamFunction == rhs._beamFunction) ) ivarsEqual = false;
    if( ! (_highDensityTrackJam == rhs._highDensityTrackJam) ) ivarsEqual = false;
    if( ! (_beamStatus == rhs._beamStatus) ) ivarsEqual = false;
    if( ! (_jammingTechnique == rhs._jammingTechnique) ) ivarsEqual = false;

    for(size_t idx = 0; idx < _trackJamTargets.size(); idx++)
    {
       if( ! ( _trackJamTargets[idx] == rhs._trackJamTargets[idx]) ) ivarsEqual = false;
    }

    return ivarsEqual;
}